

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::GroupInfo::GroupInfo(GroupInfo *this,string *_name,size_t _groupIndex,size_t _groupsCount)

{
  size_t _groupsCount_local;
  size_t _groupIndex_local;
  string *_name_local;
  GroupInfo *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)_name);
  this->groupIndex = _groupIndex;
  this->groupsCounts = _groupsCount;
  return;
}

Assistant:

GroupInfo::GroupInfo(  std::string const& _name,
                           std::size_t _groupIndex,
                           std::size_t _groupsCount )
    :   name( _name ),
        groupIndex( _groupIndex ),
        groupsCounts( _groupsCount )
    {}